

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

bool chaiscript::dispatch::detail::compare_types_cast<void,std::__cxx11::string&,char>
               (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_char
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  boxed_cast<std::__cxx11::string&>(params->m_begin,t_conversions);
  boxed_cast<char>(params->m_begin + 1,t_conversions);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }